

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PduHeader.cpp
# Opt level: O2

void __thiscall DIS::PduHeader::unmarshal(PduHeader *this,DataStream *dataStream)

{
  DataStream::operator>>(dataStream,&this->_protocolVersion);
  DataStream::operator>>(dataStream,&this->_exerciseID);
  DataStream::operator>>(dataStream,&this->_pduType);
  DataStream::operator>>(dataStream,&this->_protocolFamily);
  DataStream::operator>>(dataStream,&this->_timestamp);
  DataStream::operator>>(dataStream,&this->_pduLength);
  DataStream::operator>>(dataStream,&this->_pduStatus);
  DataStream::operator>>(dataStream,&this->_padding);
  return;
}

Assistant:

void PduHeader::unmarshal(DataStream& dataStream)
{
    dataStream >> _protocolVersion;
    dataStream >> _exerciseID;
    dataStream >> _pduType;
    dataStream >> _protocolFamily;
    dataStream >> _timestamp;
    dataStream >> _pduLength;
    dataStream >> _pduStatus;
    dataStream >> _padding;
}